

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::nrmore(Forth *this)

{
  uint x;
  uint x_00;
  ulong local_20;
  size_t i;
  uint index;
  Forth *this_local;
  
  requireRStackDepth(this,1,"NR>");
  x = ForthStack<unsigned_int>::getTop(&this->rStack);
  rpop(this);
  requireRStackDepth(this,(ulong)x,"NR>");
  requireDStackAvailable(this,(ulong)(x + 1),"R>");
  for (local_20 = 0; local_20 < x; local_20 = local_20 + 1) {
    x_00 = ForthStack<unsigned_int>::getTop(&this->rStack);
    push(this,x_00);
    rpop(this);
  }
  push(this,x);
  return;
}

Assistant:

void nrmore() {
			REQUIRE_RSTACK_DEPTH(1, "NR>");
			auto index = rStack.getTop(); rpop();
			REQUIRE_RSTACK_DEPTH(index, "NR>");
			REQUIRE_DSTACK_AVAILABLE(index+1, "R>");
			for(size_t i=0;i<index;++i){
			 push(rStack.getTop()); rpop();
			}
			push(index);
		}